

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp_final(blake2sp_state *S,void *out,size_t outlen)

{
  size_t local_138;
  size_t left;
  size_t i;
  uint8_t hash [8] [32];
  size_t outlen_local;
  void *out_local;
  blake2sp_state *S_local;
  
  if ((out == (void *)0x0) || (outlen < S->outlen)) {
    S_local._4_4_ = -1;
  }
  else {
    hash[7]._24_8_ = outlen;
    for (left = 0; left < 8; left = left + 1) {
      if (left << 6 < S->buflen) {
        local_138 = S->buflen + left * -0x40;
        if (0x40 < local_138) {
          local_138 = 0x40;
        }
        blake2s_update(S->S[left],S->buf + left * 0x40,local_138);
      }
      blake2s_final(S->S[left],hash[left - 1] + 0x18,0x20);
    }
    for (left = 0; left < 8; left = left + 1) {
      blake2s_update(S->R,hash[left - 1] + 0x18,0x20);
    }
    S_local._4_4_ = blake2s_final(S->R,out,S->outlen);
  }
  return S_local._4_4_;
}

Assistant:

int blake2sp_final( blake2sp_state *S, void *out, size_t outlen )
{
  uint8_t hash[PARALLELISM_DEGREE][BLAKE2S_OUTBYTES];
  size_t i;

  if(out == NULL || outlen < S->outlen) {
    return -1;
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
  {
    if( S->buflen > i * BLAKE2S_BLOCKBYTES )
    {
      size_t left = S->buflen - i * BLAKE2S_BLOCKBYTES;

      if( left > BLAKE2S_BLOCKBYTES ) left = BLAKE2S_BLOCKBYTES;

      blake2s_update( S->S[i], S->buf + i * BLAKE2S_BLOCKBYTES, left );
    }

    blake2s_final( S->S[i], hash[i], BLAKE2S_OUTBYTES );
  }

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    blake2s_update( S->R, hash[i], BLAKE2S_OUTBYTES );

  return blake2s_final( S->R, out, S->outlen );
}